

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DefaultLogger.cpp
# Opt level: O3

uint __thiscall Assimp::DefaultLogger::GetThreadID(DefaultLogger *this)

{
  return 0;
}

Assistant:

unsigned int DefaultLogger::GetThreadID()
{
    // fixme: we can get this value via std::threads
    // std::this_thread::get_id().hash() returns a (big) size_t, not sure if this is useful in this case.
#ifdef WIN32
    return (unsigned int)::GetCurrentThreadId();
#else
    return 0; // not supported
#endif
}